

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O3

bool Allocations::allocateSubArea
               (int64_t fileID,int64_t *position,int64_t minRange,int64_t maxRange,int64_t size)

{
  long lVar1;
  _Base_ptr position_00;
  _Base_ptr p_Var2;
  int64_t iVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  long lVar6;
  bool bVar7;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  long local_78;
  Key local_68;
  _Base_ptr local_58;
  _Base_ptr p_Stack_50;
  undefined8 local_48;
  SubArea local_40;
  
  p_Var4 = allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = size;
  if ((_Rb_tree_header *)allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &allocations._M_t._M_impl.super__Rb_tree_header) {
    do {
      local_68.fileID = *(int64_t *)(p_Var4 + 1);
      position_00 = p_Var4[1]._M_parent;
      local_58 = p_Var4[1]._M_left;
      p_Var2 = p_Var4[1]._M_right;
      local_48 = *(undefined8 *)(p_Var4 + 2);
      local_68.position = (int64_t)position_00;
      p_Stack_50 = p_Var2;
      if ((local_68.fileID == fileID) &&
         (local_48._1_1_ = (char)((ulong)local_48 >> 8), bVar7 = local_48._1_1_ == '\x01', bVar7)) {
        if (minRange == -1) {
          if (maxRange == -1 || (long)position_00 <= maxRange) goto LAB_0017789b;
        }
        else if ((minRange <= (long)&position_00->_M_color + (long)&local_58->_M_color) &&
                (maxRange == -1 || (long)position_00 <= maxRange)) {
LAB_0017789b:
          iVar3 = getSubAreaUsage(fileID,(int64_t)position_00);
          local_40.offset = (long)&p_Var2->_M_color + iVar3;
          lVar5 = (long)&position_00->_M_color + local_40.offset;
          if ((minRange == -1 || minRange <= lVar5) && (maxRange == -1 || lVar5 <= maxRange)) {
            if ((((keepPositions != false) && (lVar1 = *position, lVar1 != -1)) && (lVar5 < lVar1))
               && (lVar6 = lVar1 - (long)position_00,
                  lVar6 != local_40.offset && lVar6 + local_78 <= (long)local_58)) {
              local_78 = (local_78 - local_40.offset) + lVar6;
              keptPositions = true;
              lVar5 = lVar1;
            }
            if (local_78 + local_40.offset <= (long)local_58) {
              *position = lVar5;
              local_40.size = local_78;
              std::
              _Rb_tree<Allocations::Key,std::pair<Allocations::Key_const,Allocations::SubArea>,std::_Select1st<std::pair<Allocations::Key_const,Allocations::SubArea>>,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::SubArea>>>
              ::_M_emplace_equal<Allocations::Key_const&,Allocations::SubArea>
                        ((_Rb_tree<Allocations::Key,std::pair<Allocations::Key_const,Allocations::SubArea>,std::_Select1st<std::pair<Allocations::Key_const,Allocations::SubArea>>,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::SubArea>>>
                          *)&subAreas,&local_68,&local_40);
              return true;
            }
          }
        }
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &allocations._M_t._M_impl.super__Rb_tree_header);
  }
  nextKeepPositions = false;
  return false;
}

Assistant:

bool Allocations::allocateSubArea(int64_t fileID, int64_t& position, int64_t minRange, int64_t maxRange, int64_t size)
{
	for (auto it : allocations)
	{
		if (it.first.fileID != fileID || !it.second.shared)
			continue;
		if (minRange != -1 && it.first.position + it.second.space < minRange)
			continue;
		if (maxRange != -1 && it.first.position > maxRange)
			continue;

		int64_t actualUsage = it.second.usage + getSubAreaUsage(it.first);
		int64_t possiblePosition = it.first.position + actualUsage;
		if (minRange != -1 && possiblePosition < minRange)
			continue;
		if (maxRange != -1 && possiblePosition > maxRange)
			continue;

		// Can we use the position it had before?  Nudge up size if so.
		if (keepPositions && position != -1 && position > possiblePosition)
		{
			int64_t offset = position - it.first.position;
			if (it.second.space >= offset + size && offset != actualUsage)
			{
				size += offset - actualUsage;
				keptPositions = true;
				// Fall through to reuse the emplace.
				possiblePosition = position;
			}
		}

		if (it.second.space >= actualUsage + size)
		{
			position = possiblePosition;
			subAreas.emplace(it.first, SubArea{ actualUsage, size });
			return true;
		}
	}

	nextKeepPositions = false;
	return false;
}